

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

uint64_t lzma_lzma_encoder_memusage(void *options)

{
  _Bool _Var1;
  uint64_t uVar2;
  uint64_t lz_memusage;
  lzma_lz_options_conflict lz_options;
  void *options_local;
  
  lz_options._56_8_ = options;
  _Var1 = is_options_valid((lzma_options_lzma *)options);
  if (_Var1) {
    set_lz_options((lzma_lz_options_conflict *)&lz_memusage,(lzma_options_lzma *)lz_options._56_8_);
    uVar2 = lzma_lz_encoder_memusage((lzma_lz_options_conflict *)&lz_memusage);
    if (uVar2 == 0xffffffffffffffff) {
      options_local = (void *)0xffffffffffffffff;
    }
    else {
      options_local = (void *)(uVar2 + 0x3cee8);
    }
  }
  else {
    options_local = (void *)0xffffffffffffffff;
  }
  return (uint64_t)options_local;
}

Assistant:

extern uint64_t
lzma_lzma_encoder_memusage(const void *options)
{
	lzma_lz_options lz_options;
	uint64_t lz_memusage;

	if (!is_options_valid(options))
		return UINT64_MAX;

	set_lz_options(&lz_options, options);

	lz_memusage = lzma_lz_encoder_memusage(&lz_options);
	if (lz_memusage == UINT64_MAX)
		return UINT64_MAX;

	return (uint64_t)(sizeof(lzma_coder)) + lz_memusage;
}